

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler *
llama_sampler_init_dry_testing
          (int32_t context_size,float dry_multiplier,float dry_base,int32_t dry_allowed_length,
          int32_t dry_penalty_last_n,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *seq_breakers)

{
  bool bVar1;
  reference this;
  const_iterator __last;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  const_iterator this_00;
  undefined8 in_RCX;
  size_t in_stack_00000010;
  char **in_stack_00000018;
  int32_t in_stack_00000024;
  int32_t in_stack_00000028;
  float in_stack_0000002c;
  float in_stack_00000030;
  int32_t in_stack_00000034;
  llama_vocab *in_stack_00000038;
  vector<int,_std::allocator<int>_> tail_tokens;
  llama_token head_token;
  vector<int,_std::allocator<int>_> *breaker;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range2;
  llama_sampler_dry *ctx;
  llama_sampler *result;
  llama_vocab dummy_vocab;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffff28;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
  in_stack_ffffffffffffff30;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_ffffffffffffff38;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_01;
  allocator_type *in_stack_ffffffffffffff58;
  __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_58;
  undefined8 local_50;
  llama_sampler_context_t local_48;
  llama_sampler *local_30;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_28 [8];
  undefined8 local_20;
  
  this_01 = local_28;
  local_20 = in_RCX;
  llama_vocab::llama_vocab((llama_vocab *)this_01);
  local_30 = llama_sampler_init_dry
                       (in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c,
                        in_stack_00000028,in_stack_00000024,in_stack_00000018,in_stack_00000010);
  local_48 = local_30->ctx;
  std::
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear((unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)0x518daa);
  bVar1 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::empty(this_01);
  if (bVar1) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "empty DRY sequence breakers list in llama_sampler_init_dry_testing\n");
  }
  else {
    local_50 = local_20;
    local_58._M_current =
         (vector<int,_std::allocator<int>_> *)
         std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::begin(in_stack_ffffffffffffff28);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::end(in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                               *)in_stack_ffffffffffffff30._M_cur,
                              (__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator*(&local_58);
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)this_01);
      if (bVar1) {
        llama_log_internal(GGML_LOG_LEVEL_WARN,"skipping DRY empty sequence breaker\n");
      }
      else {
        std::vector<int,_std::allocator<int>_>::operator[](this,0);
        __last = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
        __first = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator+((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff38,
                              (difference_type)in_stack_ffffffffffffff30._M_cur);
        this_00 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff38 =
             (unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&stack0xffffffffffffff5f;
        std::allocator<int>::allocator((allocator<int> *)0x518ed3);
        std::vector<int,std::allocator<int>>::
        vector<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,_std::allocator<int>_> *)this_00._M_current,__first,
                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   __last._M_current,in_stack_ffffffffffffff58);
        std::allocator<int>::~allocator((allocator<int> *)0x518ef8);
        in_stack_ffffffffffffff30._M_cur =
             (__node_type *)
             std::
             unordered_multimap<int,std::vector<int,std::allocator<int>>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
             ::emplace<int&,std::vector<int,std::allocator<int>>>
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30._M_cur,
                        (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)this_01);
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(&local_58);
    }
    bVar1 = std::
            unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::empty((unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     *)0x518f91);
    if (bVar1) {
      llama_log_internal(GGML_LOG_LEVEL_WARN,
                         "no valid DRY sequence breakers processed in llama_sampler_init_dry_testing\n"
                        );
    }
  }
  llama_vocab::~llama_vocab((llama_vocab *)0x518fc9);
  return local_30;
}

Assistant:

struct llama_sampler * llama_sampler_init_dry_testing(int32_t context_size, float dry_multiplier, float dry_base, int32_t dry_allowed_length, int32_t dry_penalty_last_n, const std::vector<std::vector<llama_token>>& seq_breakers) {
    llama_vocab dummy_vocab;
    auto * result = llama_sampler_init_dry(&dummy_vocab, context_size, dry_multiplier, dry_base, dry_allowed_length, dry_penalty_last_n, NULL, 0);
    auto * ctx = (llama_sampler_dry *) result->ctx;

    // Process the token-based sequence breakers
    ctx->dry_processed_breakers.clear();
    if (seq_breakers.empty()) {
        LLAMA_LOG_WARN("empty DRY sequence breakers list in llama_sampler_init_dry_testing\n");
    } else {
        for (const auto& breaker : seq_breakers) {
            if (breaker.empty()) {
                LLAMA_LOG_WARN("skipping DRY empty sequence breaker\n");
                continue;
            }
            llama_token head_token = breaker[0];
            std::vector<llama_token> tail_tokens(breaker.begin() + 1, breaker.end());
            ctx->dry_processed_breakers.emplace(head_token, std::move(tail_tokens));
        }

        if (ctx->dry_processed_breakers.empty()) {
            LLAMA_LOG_WARN("no valid DRY sequence breakers processed in llama_sampler_init_dry_testing\n");
        }
    }

    return result;
}